

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

Float __thiscall pbrt::FloatBilerpTexture::Evaluate(FloatBilerpTexture *this,TextureEvalContext ctx)

{
  initializer_list<float> v;
  TextureEvalContext ctx_00;
  undefined1 auVar1 [64];
  Float FVar2;
  undefined1 extraout_var [56];
  Point2f st;
  Vector2f dstdy;
  Vector2f dstdx;
  undefined1 auVar3 [56];
  iterator in_stack_ffffffffffffff18;
  undefined1 (*pauVar5) [64];
  Vector2f *dstdy_00;
  Vector2f *dstdx_00;
  TextureMapping2DHandle *in_stack_ffffffffffffff38;
  Tuple2<pbrt::Point2,_float> *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 auVar6 [12];
  undefined1 in_stack_ffffffffffffff68 [16];
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  Tuple2<pbrt::Point2,_float> local_20;
  Vector2f local_18;
  Vector2f local_10 [2];
  undefined1 auVar4 [24];
  
  pauVar5 = (undefined1 (*) [64])&stack0x00000008;
  dstdy_00 = local_10;
  Vector2<float>::Vector2((Vector2<float> *)0x504b9b);
  dstdx_00 = &local_18;
  Vector2<float>::Vector2((Vector2<float> *)0x504bad);
  auVar1 = vmovdqu64_avx512f(*pauVar5);
  auVar1 = vmovdqu64_avx512f(auVar1);
  auVar1 = vmovdqu64_avx512f(auVar1);
  auVar1 = vmovdqu64_avx512f(auVar1);
  auVar3 = auVar1._40_56_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_ffffffffffffff54;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_ffffffffffffff50;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_ffffffffffffff58;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffff60;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  auVar6 = in_stack_ffffffffffffff68._0_12_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar6._0_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar6._4_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar6._8_4_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_ffffffffffffff68._12_4_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_ffffffffffffff78;
  ctx_00.dudx = (Float)in_stack_ffffffffffffff7c;
  ctx_00.dudy = (Float)(int)in_stack_ffffffffffffff80;
  ctx_00.dvdx = (Float)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  ctx_00.dvdy = (Float)(int)in_stack_ffffffffffffff88;
  ctx_00.faceIndex = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  auVar1._0_8_ = TextureMapping2DHandle::Map(in_stack_ffffffffffffff38,ctx_00,dstdx_00,dstdy_00);
  auVar1._8_56_ = extraout_var;
  local_20 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar1._0_16_);
  this_00 = &local_20;
  Tuple2<pbrt::Point2,_float>::operator[](this_00,0);
  Tuple2<pbrt::Point2,_float>::operator[](this_00,1);
  v._M_len = (size_type)pauVar5;
  v._M_array = in_stack_ffffffffffffff18;
  pstd::array<float,_2>::array(auVar3._16_8_,v);
  auVar4 = auVar3._32_24_;
  pstd::span<const_float>::span(auVar3._0_8_,auVar3._8_16_);
  FVar2 = Bilerp((array<float,_2>)auVar4._16_8_,auVar4._0_16_);
  return FVar2;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Bilerp({st[0], st[1]}, {v00, v10, v01, v11});
    }